

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O0

Int128 __thiscall ClipperLib::Int128::operator/(Int128 *this,Int128 *rhs)

{
  long lVar1;
  long lVar2;
  bool bVar3;
  undefined8 *puVar4;
  Int128 *in_RDX;
  long64 extraout_RDX;
  long64 extraout_RDX_00;
  long64 lVar5;
  Int128 IVar6;
  undefined1 local_70 [8];
  Int128 p2;
  undefined1 auStack_58 [4];
  int i;
  Int128 p;
  Int128 denom;
  Int128 result;
  bool negate;
  Int128 *rhs_local;
  Int128 *this_local;
  
  if ((in_RDX->lo == 0) && (in_RDX->hi == 0)) {
    puVar4 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar4 = "Int128 operator/: divide by zero";
    __cxa_throw(puVar4,&char_const*::typeinfo,0);
  }
  lVar1 = in_RDX->hi;
  lVar2 = rhs->hi;
  Int128((Int128 *)&denom.lo,rhs);
  Int128((Int128 *)&p.lo,in_RDX);
  if (denom.lo < 0) {
    Negate((Int128 *)&denom.lo);
  }
  if (p.lo < 0) {
    Negate((Int128 *)&p.lo);
  }
  bVar3 = operator>((Int128 *)&p.lo,(Int128 *)&denom.lo);
  if (bVar3) {
    Int128(this,0);
    lVar5 = extraout_RDX;
  }
  else {
    Negate((Int128 *)&p.lo);
    Int128((Int128 *)auStack_58,0);
    for (p2.lo._4_4_ = 0; p2.lo._4_4_ < 0x80; p2.lo._4_4_ = p2.lo._4_4_ + 1) {
      _auStack_58 = _auStack_58 * 2;
      if (p.hi < 0) {
        _auStack_58 = _auStack_58 + 1;
      }
      p.hi = p.hi * 2;
      if (denom.lo < 0) {
        p.hi = p.hi + 1;
      }
      denom.lo = denom.lo * 2;
      if (result.hi < 0) {
        denom.lo = denom.lo + 1;
      }
      result.hi = result.hi * 2;
      Int128((Int128 *)local_70,(Int128 *)auStack_58);
      operator+=((Int128 *)auStack_58,(Int128 *)&p.lo);
      if (_auStack_58 < 0) {
        _auStack_58 = (long)local_70;
        p.hi = p2.hi;
      }
      else {
        result.hi = result.hi + 1;
      }
    }
    if (lVar1 < 0 != lVar2 < 0) {
      Negate((Int128 *)&denom.lo);
    }
    Int128(this,(Int128 *)&denom.lo);
    lVar5 = extraout_RDX_00;
  }
  IVar6.lo = lVar5;
  IVar6.hi = (long64)this;
  return IVar6;
}

Assistant:

Int128 operator/ (const Int128 &rhs) const
    {
      if (rhs.lo == 0 && rhs.hi == 0)
        throw "Int128 operator/: divide by zero";
      bool negate = (rhs.hi < 0) != (hi < 0);
      Int128 result(*this), denom(rhs);
      if (result.hi < 0) Negate(result);
      if (denom.hi < 0)  Negate(denom);
      if (denom > result) return Int128(0); //result is only a fraction of 1
      Negate(denom);

      Int128 p(0);
      for (int i = 0; i < 128; ++i)
      {
        p.hi = p.hi << 1;
        if (p.lo < 0) p.hi++;
        p.lo = long64(p.lo) << 1;
        if (result.hi < 0) p.lo++;
        result.hi = result.hi << 1;
        if (result.lo < 0) result.hi++;
        result.lo = long64(result.lo) << 1;
        Int128 p2(p);
        p += denom;
        if (p.hi < 0) p = p2;
        else result.lo++;
      }
      if (negate) Negate(result);
      return result;
    }